

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O2

Filter * __thiscall
helics::ConnectorFederateManager::getFilter(ConnectorFederateManager *this,string_view name)

{
  undefined1 *puVar1;
  BlockIterator<const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_*const_*>
  filt;
  shared_handle sharedFilt;
  BlockIterator<const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_*const_*>
  local_60;
  shared_handle local_48;
  const_iterator local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock_shared(&local_48,&this->filters);
  gmlc::containers::
  StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
  ::find(&local_60,local_48.data,name);
  gmlc::containers::
  StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
  ::end(&local_30,&(local_48.data)->dataStorage);
  if ((local_60.offset == local_30.offset) && (local_60.vec == local_30.vec)) {
    puVar1 = invalidFilt;
  }
  else {
    puVar1 = (undefined1 *)
             ((local_60.ptr)->_M_t).
             super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
             super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
             super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_48.m_handle_lock);
  return (Filter *)puVar1;
}

Assistant:

const Filter& ConnectorFederateManager::getFilter(std::string_view name) const
{
    auto sharedFilt = filters.lock_shared();
    auto filt = sharedFilt->find(name);
    return (filt != sharedFilt.end()) ? (**filt) : invalidFilt;
}